

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O3

void __thiscall
rigtorp::mpmc::Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_>::pop
          (Queue<unsigned_long,_std::allocator<rigtorp::mpmc::Slot<unsigned_long>_>_> *this,
          unsigned_long *v)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  Slot<unsigned_long> *pSVar3;
  
  LOCK();
  paVar1 = &this->tail_;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  pSVar3 = this->slots_ + uVar2 % this->capacity_;
  do {
  } while ((uVar2 / this->capacity_) * 2 + 1 !=
           (pSVar3->turn).super___atomic_base<unsigned_long>._M_i);
  *v = (unsigned_long)pSVar3->storage;
  (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = (uVar2 / this->capacity_) * 2 + 2;
  return;
}

Assistant:

void pop(T &v) noexcept {
    auto const tail = tail_.fetch_add(1);
    auto &slot = slots_[idx(tail)];
    while (turn(tail) * 2 + 1 != slot.turn.load(std::memory_order_acquire))
      ;
    v = slot.move();
    slot.destroy();
    slot.turn.store(turn(tail) * 2 + 2, std::memory_order_release);
  }